

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderMaxPatchVertices::initTest(TessellationShaderMaxPatchVertices *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x708))(1,&this->m_vao_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x171);
  (**(code **)(lVar3 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x174);
  (**(code **)(lVar3 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,
             &this->m_gl_max_patch_vertices);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x178);
  (**(code **)(lVar3 + 0xfd8))
            ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,this->m_gl_max_patch_vertices);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x17c);
  initProgramObjects(this);
  initTransformFeedbackBufferObjects(this);
  initVertexBufferObjects(this);
  initReferenceValues(this);
  return;
}

Assistant:

void TessellationShaderMaxPatchVertices::initTest(void)
{
	/* This test runs for two cases:
	 *
	 * 1) The patch size is explicitly defined to be equal to gl_MaxPatchVertices.
	 *    (The Tessellation Control Shader gets 32 vertices, then it access them
	 *    and it outputs 2 vertices to Tessllation Evaluation Shader. Next Tessllation
	 *    Evaluation Shader sends 1 segment of an isoline  to the output).
	 * 2) The patch size is implicitly defined to be equal to gl_MaxPatchVertices.
	 *    (There is no Tessellation Control Shader. Tessllation Evaluation Shader
	 *    gets 32 vertices, then it access them. Next (gl_MaxPatchVertices-1) segments
	 *    of the isoline are send to the output.)
	 */

	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Query GL_MAX_PATCH_VERTICES_EXT value */
	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &m_gl_max_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname!");

	/* Set maximum number of vertices in the patch. */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, m_gl_max_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname!");

	/* Build programs */
	initProgramObjects();

	/* Initialize tessellation buffers */
	initTransformFeedbackBufferObjects();

	/* Initialize input vertices */
	initVertexBufferObjects();

	/* Reference values setup */
	initReferenceValues();
}